

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O2

int check_in_range(unsigned_long value,unsigned_long check_value_data)

{
  int iVar1;
  
  _assert_true(check_value_data,"check_integer_range",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/build_O2/_deps/cmocka-src/src/cmocka.c"
               ,0x5a5);
  iVar1 = integer_in_range_display_error
                    (value,*(unsigned_long *)(check_value_data + 0x28),
                     *(unsigned_long *)(check_value_data + 0x30));
  return iVar1;
}

Assistant:

static int check_in_range(const LargestIntegralType value,
                          const LargestIntegralType check_value_data) {
    CheckIntegerRange * const check_integer_range =
        cast_largest_integral_type_to_pointer(CheckIntegerRange*,
                                              check_value_data);
    assert_non_null(check_integer_range);
    return integer_in_range_display_error(value, check_integer_range->minimum,
                                          check_integer_range->maximum);
}